

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

Sub * __thiscall
google::protobuf::io::Printer::Sub::WithSuffix
          (Sub *__return_storage_ptr__,Sub *this,string *sub_suffix)

{
  std::__cxx11::string::operator=((string *)&(this->value_).consume_after,(string *)sub_suffix);
  Sub(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Sub WithSuffix(std::string sub_suffix) && {
    value_.consume_after = std::move(sub_suffix);
    return std::move(*this);
  }